

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uptime.cpp
# Opt level: O0

string * uptime_abi_cxx11_(void)

{
  byte bVar1;
  char *pcVar2;
  string *in_RDI;
  string local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  string local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  undefined1 local_249;
  int local_248;
  int local_244;
  int secs;
  int mins;
  int hours;
  int days;
  double uptime;
  allocator<char> local_225 [13];
  long local_218;
  ifstream infile;
  string *output;
  
  std::ifstream::ifstream(&local_218,"/proc/uptime",_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::istream::operator>>((istream *)&local_218,(double *)&hours);
    mins = (int)(_hours / 86400.0);
    secs = (int)((_hours - (double)(mins * 0x15180)) / 3600.0);
    local_244 = (int)(((_hours - (double)(mins * 0x15180)) - (double)(secs * 0xe10)) / 60.0);
    local_248 = (int)(((_hours - (double)(mins * 0x15180)) - (double)(secs * 0xe10)) -
                     (double)(local_244 * 0x3c));
    local_249 = 0;
    std::__cxx11::string::string((string *)in_RDI);
    if (mins != 0) {
      std::__cxx11::to_string(&local_2b0,mins);
      std::operator+(&local_290,&local_2b0,"day");
      pcVar2 = " ";
      if (1 < mins) {
        pcVar2 = "s ";
      }
      std::operator+(&local_270,&local_290,pcVar2);
      std::__cxx11::string::operator+=((string *)in_RDI,(string *)&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
    }
    if (secs != 0) {
      std::__cxx11::to_string(&local_310,secs);
      std::operator+(&local_2f0,&local_310,"hour");
      pcVar2 = " ";
      if (1 < secs) {
        pcVar2 = "s ";
      }
      std::operator+(&local_2d0,&local_2f0,pcVar2);
      std::__cxx11::string::operator+=((string *)in_RDI,(string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
    }
    if (local_244 != 0) {
      std::__cxx11::to_string(&local_370,local_244);
      std::operator+(&local_350,&local_370,"min");
      pcVar2 = " ";
      if (1 < local_244) {
        pcVar2 = "s ";
      }
      std::operator+(&local_330,&local_350,pcVar2);
      std::__cxx11::string::operator+=((string *)in_RDI,(string *)&local_330);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_370);
    }
    if (local_248 != 0) {
      std::__cxx11::to_string(&local_3d0,local_248);
      std::operator+(&local_3b0,&local_3d0,"sec");
      pcVar2 = "";
      if (1 < local_248) {
        pcVar2 = "s";
      }
      std::operator+(&local_390,&local_3b0,pcVar2);
      std::__cxx11::string::operator+=((string *)in_RDI,(string *)&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3d0);
    }
    local_249 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"Unknown",local_225);
    std::allocator<char>::~allocator(local_225);
  }
  uptime._4_4_ = 1;
  std::ifstream::~ifstream(&local_218);
  return in_RDI;
}

Assistant:

std::string uptime() {
  std::ifstream infile("/proc/uptime");
  if (!infile) {
    return "Unknown";
  }

  double uptime;
  infile >> uptime;

  int days = static_cast<int>(uptime / 86400);
  int hours = static_cast<int>((uptime - days * 86400) / 3600);
  int mins = static_cast<int>((uptime - days * 86400 - hours * 3600) / 60);
  int secs = static_cast<int>(uptime - days * 86400 - hours * 3600 - mins * 60);

  std::string output;

  if (days) {
    output += std::to_string(days) + "day" + (days > 1 ? "s " : " ");
  }

  if (hours) {
    output += std::to_string(hours) + "hour" + (hours > 1 ? "s " : " ");
  }

  if (mins) {
    output += std::to_string(mins) + "min" + (mins > 1 ? "s " : " ");
  }

  if (secs) {
    output += std::to_string(secs) + "sec" + (secs > 1 ? "s" : "");
  }

  return output;
}